

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenCopyCtorAssignOpDefs(CppGenerator *this,StructDef *struct_def)

{
  Value *type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  BaseType BVar3;
  FieldDef *pFVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  FieldDef *pFVar9;
  long lVar10;
  pointer ppFVar11;
  long lVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  CodeWriter *this_00;
  pointer ppFVar15;
  byte bVar16;
  string initializer_list;
  string swaps;
  string vector_copies;
  CodeWriter cw;
  _Alloc_hider local_518;
  undefined4 local_510;
  undefined4 uStack_50c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_508;
  string local_4f8;
  string local_4d8;
  pointer local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  ios_base *local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  CppGenerator *local_460;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  StructDef *local_2d8;
  string local_2d0;
  undefined1 local_2b0 [48];
  stringstream local_280 [128];
  ios_base aiStack_200 [264];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  int local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((0 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) &&
     (bVar5 = NeedsCopyCtorAssignOp(this,struct_def), bVar5)) {
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    local_4b0._M_string_length = 0;
    local_4b0.field_2._M_local_buf[0] = '\0';
    local_2f8 = &local_2e8;
    local_2f0 = 0;
    local_2e8 = 0;
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    local_480._M_string_length = 0;
    local_480.field_2._M_local_buf[0] = '\0';
    ppFVar15 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar11 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_4b8 = ppFVar11;
    if (ppFVar15 != ppFVar11) {
      local_488 = &local_e8;
      local_490 = aiStack_200;
      local_460 = this;
      local_2d8 = struct_def;
      do {
        pFVar4 = *ppFVar15;
        if (pFVar4->deprecated == false) {
          type = &pFVar4->value;
          BVar3 = (type->type).base_type;
          if ((int)BVar3 < 0xf) {
            if (BVar3 == BASE_TYPE_UTYPE) goto LAB_00196caf;
            if (BVar3 == BASE_TYPE_VECTOR) goto LAB_00195f6c;
LAB_00195ff5:
            if (local_4b0._M_string_length != 0) {
              std::__cxx11::string::append((char *)&local_4b0);
            }
            local_3f8._M_string_length = 0;
            local_3f8.field_2._M_local_buf[0] = '\0';
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            CodeWriter::CodeWriter((CodeWriter *)local_2b0,&local_3f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,
                              CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                       local_3f8.field_2._M_local_buf[0]) + 1);
            }
            local_518._M_p = (pointer)&aStack_508;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"FIELD","");
            Name_abi_cxx11_(&local_4f8,this,*ppFVar15);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_2b0,(key_type *)&local_518);
            std::__cxx11::string::_M_assign((string *)pmVar8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
              operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_p != &aStack_508) {
              operator_delete(local_518._M_p,
                              CONCAT44(aStack_508._M_allocated_capacity._4_4_,
                                       aStack_508._M_allocated_capacity._0_4_) + 1);
            }
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_418,"{{FIELD}}(o.{{FIELD}})\\","");
            CodeWriter::operator+=((CodeWriter *)local_2b0,&local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_518._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_p != &aStack_508) {
              operator_delete(local_518._M_p,
                              CONCAT44(aStack_508._M_allocated_capacity._4_4_,
                                       aStack_508._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_p != local_488) {
              operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream(local_280);
            std::ios_base::~ios_base(local_490);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_2b0);
          }
          else {
            if (BVar3 == BASE_TYPE_VECTOR64) {
LAB_00195f6c:
              local_518._M_p._0_4_ = (pFVar4->value).type.element;
              aStack_508._8_2_ = (pFVar4->value).type.fixed_length;
              local_518._M_p._4_4_ = 0;
              local_510 = *(undefined4 *)&(pFVar4->value).type.struct_def;
              uStack_50c = *(undefined4 *)((long)&(pFVar4->value).type.struct_def + 4);
              aStack_508._M_allocated_capacity._0_4_ = *(undefined4 *)&(pFVar4->value).type.enum_def
              ;
              aStack_508._M_allocated_capacity._4_4_ =
                   *(undefined4 *)((long)&(pFVar4->value).type.enum_def + 4);
              if ((BaseType)local_518._M_p == BASE_TYPE_UTYPE) goto LAB_00196caf;
              pFVar4 = *ppFVar15;
              local_2b0._0_8_ = local_2b0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"cpp_type","");
              cVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)&(pFVar4->super_Definition).attributes,(key_type *)local_2b0);
              if ((_Rb_tree_header *)cVar7._M_node ==
                  &(pFVar4->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
                lVar10 = 0;
              }
              else {
                lVar10 = *(long *)(cVar7._M_node + 2);
              }
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
              pFVar4 = *ppFVar15;
              local_2b0._0_8_ = local_2b0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"cpp_ptr_type","")
              ;
              cVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)&(pFVar4->super_Definition).attributes,(key_type *)local_2b0);
              if ((_Rb_tree_header *)cVar7._M_node ==
                  &(pFVar4->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
                lVar12 = 0;
              }
              else {
                lVar12 = *(long *)(cVar7._M_node + 2);
              }
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
              if (lVar10 == 0) {
                GenTypeNative_abi_cxx11_(&local_4f8,this,(Type *)&local_518,true,*ppFVar15,true);
              }
              else {
                local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4f8,*(long *)(lVar10 + 0x20),
                           *(long *)(lVar10 + 0x28) + *(long *)(lVar10 + 0x20));
              }
              ppFVar11 = local_4b8;
              pFVar4 = *ppFVar15;
              bVar16 = 0;
              if ((((pFVar4->value).type.base_type - BASE_TYPE_VECTOR & 0xfffffffb) == 0) &&
                 (bVar16 = 0, (pFVar4->value).type.element == BASE_TYPE_STRUCT)) {
                if (((pFVar4->value).type.struct_def)->fixed == false) {
                  bVar16 = pFVar4->native_inline ^ 1;
                }
                else {
                  bVar16 = 0;
                }
              }
              if ((lVar10 != 0) && (bVar16 == 0)) {
                iVar6 = std::__cxx11::string::compare((char *)(lVar12 + 0x20));
                bVar16 = iVar6 != 0;
              }
              local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"  ","");
              CodeWriter::CodeWriter((CodeWriter *)local_2b0,&local_378);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p,
                                local_378.field_2._M_allocated_capacity + 1);
              }
              local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"FIELD","");
              Name_abi_cxx11_(&local_2d0,this,*ppFVar15);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_2b0,&local_4d8);
              std::__cxx11::string::_M_assign((string *)pmVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p,
                                local_4d8.field_2._M_allocated_capacity + 1);
              }
              local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"TYPE","");
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_2b0,&local_4d8);
              std::__cxx11::string::_M_assign((string *)pmVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p,
                                local_4d8.field_2._M_allocated_capacity + 1);
              }
              if (bVar16 == 0) {
                if (local_4b0._M_string_length != 0) {
                  std::__cxx11::string::append((char *)&local_4b0);
                }
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3d8,"{{FIELD}}(o.{{FIELD}})\\","");
                CodeWriter::operator+=((CodeWriter *)local_2b0,&local_3d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p,
                                  local_3d8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_append
                          ((char *)&local_4b0,(ulong)local_4d8._M_dataplus._M_p);
              }
              else {
                local_d8 = local_d8 + 1;
                local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_398,"{{FIELD}}.reserve(o.{{FIELD}}.size());","");
                CodeWriter::operator+=((CodeWriter *)local_2b0,&local_398);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != &local_398.field_2) {
                  operator_delete(local_398._M_dataplus._M_p,
                                  local_398.field_2._M_allocated_capacity + 1);
                }
                local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3b8,
                           "for (const auto &{{FIELD}}_ : o.{{FIELD}}) { {{FIELD}}.emplace_back(({{FIELD}}_) ? new {{TYPE}}(*{{FIELD}}_) : nullptr); }"
                           ,"");
                CodeWriter::operator+=((CodeWriter *)local_2b0,&local_3b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                  operator_delete(local_3b8._M_dataplus._M_p,
                                  local_3b8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_append
                          ((char *)&local_2f8,(ulong)local_4d8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p,
                                local_4d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_p != local_488) {
                operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream(local_280);
              std::ios_base::~ios_base(local_490);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_2b0);
              uVar13 = local_4f8.field_2._M_allocated_capacity;
              _Var14._M_p = local_4f8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p == &local_4f8.field_2) goto LAB_00196ac7;
            }
            else {
              if (BVar3 != BASE_TYPE_STRUCT) goto LAB_00195ff5;
              pFVar9 = pFVar4;
              if (local_4b0._M_string_length != 0) {
                std::__cxx11::string::append((char *)&local_4b0);
                pFVar9 = *ppFVar15;
              }
              local_2b0._0_8_ = local_2b0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"cpp_type","");
              cVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)&(pFVar9->super_Definition).attributes,(key_type *)local_2b0);
              if ((_Rb_tree_header *)cVar7._M_node ==
                  &(pFVar9->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
                lVar10 = 0;
              }
              else {
                lVar10 = *(long *)(cVar7._M_node + 2);
              }
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
              pFVar9 = *ppFVar15;
              local_2b0._0_8_ = local_2b0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"cpp_ptr_type","")
              ;
              cVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)&(pFVar9->super_Definition).attributes,(key_type *)local_2b0);
              if ((_Rb_tree_header *)cVar7._M_node ==
                  &(pFVar9->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
                lVar12 = 0;
              }
              else {
                lVar12 = *(long *)(cVar7._M_node + 2);
              }
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
              if (lVar10 == 0) {
                GenTypeNative_abi_cxx11_
                          ((string *)&local_518,local_460,&type->type,false,*ppFVar15,true);
              }
              else {
                local_518._M_p = (pointer)&aStack_508;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_518,*(long *)(lVar10 + 0x20),
                           *(long *)(lVar10 + 0x28) + *(long *)(lVar10 + 0x20));
              }
              bVar16 = 1;
              if (((type->type).base_type == BASE_TYPE_STRUCT) &&
                 (((pFVar4->value).type.struct_def)->fixed == true)) {
                bVar16 = (*ppFVar15)->native_inline ^ 1;
                if ((lVar10 != 0) && ((*ppFVar15)->native_inline != false)) {
                  iVar6 = std::__cxx11::string::compare((char *)(lVar12 + 0x20));
                  bVar16 = iVar6 != 0;
                }
              }
              local_318._M_string_length = 0;
              local_318.field_2._M_local_buf[0] = '\0';
              local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
              CodeWriter::CodeWriter((CodeWriter *)local_2b0,&local_318);
              this = local_460;
              paVar1 = &local_4f8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                         local_318.field_2._M_local_buf[0]) + 1);
              }
              local_4f8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"FIELD","");
              Name_abi_cxx11_(&local_4d8,this,*ppFVar15);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_2b0,&local_4f8);
              std::__cxx11::string::_M_assign((string *)pmVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p,
                                local_4d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != paVar1) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                local_4f8.field_2._M_allocated_capacity + 1);
              }
              local_4f8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"TYPE","");
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_2b0,&local_4f8);
              std::__cxx11::string::_M_assign((string *)pmVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != paVar1) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                local_4f8.field_2._M_allocated_capacity + 1);
              }
              if (bVar16 == 0) {
                local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_358,"{{FIELD}}(o.{{FIELD}})\\","");
                ppFVar11 = local_4b8;
                CodeWriter::operator+=((CodeWriter *)local_2b0,&local_358);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) {
                  operator_delete(local_358._M_dataplus._M_p,
                                  local_358.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_append
                          ((char *)&local_4b0,(ulong)local_4f8._M_dataplus._M_p);
              }
              else {
                local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_338,
                           "{{FIELD}}((o.{{FIELD}}) ? new {{TYPE}}(*o.{{FIELD}}) : nullptr)\\","");
                ppFVar11 = local_4b8;
                CodeWriter::operator+=((CodeWriter *)local_2b0,&local_338);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_dataplus._M_p != &local_338.field_2) {
                  operator_delete(local_338._M_dataplus._M_p,
                                  local_338.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_append
                          ((char *)&local_4b0,(ulong)local_4f8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != paVar1) {
                operator_delete(local_4f8._M_dataplus._M_p,
                                local_4f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_p != local_488) {
                operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream(local_280);
              std::ios_base::~ios_base(local_490);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_2b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_518._M_p == &aStack_508) goto LAB_00196ac7;
              uVar13 = CONCAT44(aStack_508._M_allocated_capacity._4_4_,
                                aStack_508._M_allocated_capacity._0_4_);
              _Var14._M_p = local_518._M_p;
            }
            operator_delete(_Var14._M_p,uVar13 + 1);
          }
LAB_00196ac7:
          if (local_480._M_string_length != 0) {
            std::__cxx11::string::append((char *)&local_480);
          }
          local_438._M_string_length = 0;
          local_438.field_2._M_local_buf[0] = '\0';
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          CodeWriter::CodeWriter((CodeWriter *)local_2b0,&local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,
                            CONCAT71(local_438.field_2._M_allocated_capacity._1_7_,
                                     local_438.field_2._M_local_buf[0]) + 1);
          }
          local_518._M_p = (pointer)&aStack_508;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"FIELD","");
          Name_abi_cxx11_(&local_4f8,this,*ppFVar15);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_2b0,(key_type *)&local_518);
          std::__cxx11::string::_M_assign((string *)pmVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_p != &aStack_508) {
            operator_delete(local_518._M_p,
                            CONCAT44(aStack_508._M_allocated_capacity._4_4_,
                                     aStack_508._M_allocated_capacity._0_4_) + 1);
          }
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_458,"std::swap({{FIELD}}, o.{{FIELD}});\\","");
          CodeWriter::operator+=((CodeWriter *)local_2b0,&local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_518._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_p != &aStack_508) {
            operator_delete(local_518._M_p,
                            CONCAT44(aStack_508._M_allocated_capacity._4_4_,
                                     aStack_508._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_p != local_488) {
            operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_280);
          std::ios_base::~ios_base(local_490);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_2b0);
        }
LAB_00196caf:
        struct_def = local_2d8;
        ppFVar15 = ppFVar15 + 1;
      } while (ppFVar15 != ppFVar11);
      if (local_4b0._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,"\n      : ",&local_4b0);
        std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_2b0);
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
      }
    }
    if (local_480._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     "  ",&local_480);
      std::__cxx11::string::operator=((string *)&local_480,(string *)local_2b0);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
    }
    pcVar2 = local_2b0 + 0x10;
    local_2b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"NATIVE_NAME","");
    EscapeKeyword(&local_4f8,this,(string *)struct_def);
    NativeName((string *)&local_518,&local_4f8,struct_def,&(this->opts_).super_IDLOptions);
    this_00 = &this->code_;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,(key_type *)local_2b0);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_p != &aStack_508) {
      operator_delete(local_518._M_p,
                      CONCAT44(aStack_508._M_allocated_capacity._4_4_,
                               aStack_508._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_2b0._0_8_ != pcVar2) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    local_2b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"INIT_LIST","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,(key_type *)local_2b0);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((pointer)local_2b0._0_8_ != pcVar2) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    local_2b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"VEC_COPY","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,(key_type *)local_2b0);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((pointer)local_2b0._0_8_ != pcVar2) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    local_2b0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"SWAPS","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,(key_type *)local_2b0);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((pointer)local_2b0._0_8_ != pcVar2) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "inline {{NATIVE_NAME}}::{{NATIVE_NAME}}(const {{NATIVE_NAME}} &o){{INIT_LIST}} {",""
              );
    CodeWriter::operator+=(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{{VEC_COPY}}}\n","");
    CodeWriter::operator+=(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "inline {{NATIVE_NAME}} &{{NATIVE_NAME}}::operator=({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT {"
               ,"");
    CodeWriter::operator+=(this_00,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"{{SWAPS}}","");
    CodeWriter::operator+=(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"  return *this;\n}\n","");
    CodeWriter::operator+=(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,
                      CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                               local_480.field_2._M_local_buf[0]) + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,
                      CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                               local_4b0.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void GenCopyCtorAssignOpDefs(const StructDef &struct_def) {
    if (opts_.g_cpp_std < cpp::CPP_STD_11) return;
    if (!NeedsCopyCtorAssignOp(struct_def)) return;
    std::string initializer_list;
    std::string vector_copies;
    std::string swaps;
    for (const auto &field : struct_def.fields.vec) {
      const auto &type = field->value.type;
      if (field->deprecated || type.base_type == BASE_TYPE_UTYPE) continue;
      if (type.base_type == BASE_TYPE_STRUCT) {
        if (!initializer_list.empty()) { initializer_list += ",\n        "; }
        const auto cpp_type = field->attributes.Lookup("cpp_type");
        const auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
        const std::string &type_name =
            (cpp_type) ? cpp_type->constant
                       : GenTypeNative(type, /*invector*/ false, *field,
                                       /*forcopy*/ true);
        const bool is_ptr = !(IsStruct(type) && field->native_inline) ||
                            (cpp_type && cpp_ptr_type->constant != "naked");
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw.SetValue("TYPE", type_name);
        if (is_ptr) {
          cw +=
              "{{FIELD}}((o.{{FIELD}}) ? new {{TYPE}}(*o.{{FIELD}}) : "
              "nullptr)\\";
          initializer_list += cw.ToString();
        } else {
          cw += "{{FIELD}}(o.{{FIELD}})\\";
          initializer_list += cw.ToString();
        }
      } else if (IsVector(type)) {
        const auto vec_type = type.VectorType();
        if (vec_type.base_type == BASE_TYPE_UTYPE) continue;
        const auto cpp_type = field->attributes.Lookup("cpp_type");
        const auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
        const std::string &type_name =
            (cpp_type) ? cpp_type->constant
                       : GenTypeNative(vec_type, /*invector*/ true, *field,
                                       /*forcopy*/ true);
        const bool is_ptr = IsVectorOfPointers(*field) ||
                            (cpp_type && cpp_ptr_type->constant != "naked");
        CodeWriter cw("  ");
        cw.SetValue("FIELD", Name(*field));
        cw.SetValue("TYPE", type_name);
        if (is_ptr) {
          // Use emplace_back to construct the potentially-smart pointer element
          // from a raw pointer to a new-allocated copy.
          cw.IncrementIdentLevel();
          cw += "{{FIELD}}.reserve(o.{{FIELD}}.size());";
          cw +=
              "for (const auto &{{FIELD}}_ : o.{{FIELD}}) { "
              "{{FIELD}}.emplace_back(({{FIELD}}_) ? new {{TYPE}}(*{{FIELD}}_) "
              ": nullptr); }";
          vector_copies += cw.ToString();
        } else {
          // For non-pointer elements, use std::vector's copy constructor in the
          // initializer list. This will yield better performance than an insert
          // range loop for trivially-copyable element types.
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          cw += "{{FIELD}}(o.{{FIELD}})\\";
          initializer_list += cw.ToString();
        }
      } else {
        if (!initializer_list.empty()) { initializer_list += ",\n        "; }
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw += "{{FIELD}}(o.{{FIELD}})\\";
        initializer_list += cw.ToString();
      }
      {
        if (!swaps.empty()) { swaps += "\n  "; }
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw += "std::swap({{FIELD}}, o.{{FIELD}});\\";
        swaps += cw.ToString();
      }
    }
    if (!initializer_list.empty()) {
      initializer_list = "\n      : " + initializer_list;
    }
    if (!swaps.empty()) { swaps = "  " + swaps; }

    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    code_.SetValue("INIT_LIST", initializer_list);
    code_.SetValue("VEC_COPY", vector_copies);
    code_.SetValue("SWAPS", swaps);

    code_ +=
        "inline {{NATIVE_NAME}}::{{NATIVE_NAME}}(const {{NATIVE_NAME}} &o)"
        "{{INIT_LIST}} {";
    code_ += "{{VEC_COPY}}}\n";
    code_ +=
        "inline {{NATIVE_NAME}} &{{NATIVE_NAME}}::operator="
        "({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT {";
    code_ += "{{SWAPS}}";
    code_ += "  return *this;\n}\n";
  }